

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O0

void __thiscall despot::VNode::Free(VNode *this,DSPOMDP *model)

{
  bool bVar1;
  size_type sVar2;
  reference ppSVar3;
  vector<despot::QNode_*,_std::allocator<despot::QNode_*>_> *this_00;
  QNode *this_01;
  pointer ppVar4;
  _Self local_40;
  _Self local_38;
  iterator it;
  map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
  *children;
  QNode *qnode;
  int a;
  int i;
  DSPOMDP *model_local;
  VNode *this_local;
  
  qnode._4_4_ = 0;
  while( true ) {
    sVar2 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size(&this->particles_);
    if (sVar2 <= (ulong)(long)qnode._4_4_) break;
    ppSVar3 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                        (&this->particles_,(long)qnode._4_4_);
    (*model->_vptr_DSPOMDP[0x17])(model,*ppSVar3);
    qnode._4_4_ = qnode._4_4_ + 1;
  }
  qnode._0_4_ = 0;
  while( true ) {
    this_00 = VNode::children(this);
    sVar2 = std::vector<despot::QNode_*,_std::allocator<despot::QNode_*>_>::size(this_00);
    if (sVar2 <= (ulong)(long)(int)qnode) break;
    this_01 = Child(this,(int)qnode);
    it._M_node = (_Base_ptr)QNode::children(this_01);
    local_38._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
         ::begin((map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
                  *)it._M_node);
    while( true ) {
      local_40._M_node =
           (_Base_ptr)
           std::
           map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
           ::end(it._M_node);
      bVar1 = std::operator!=(&local_38,&local_40);
      if (!bVar1) break;
      ppVar4 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_despot::VNode_*>_>::operator->
                         (&local_38);
      Free(ppVar4->second,model);
      std::_Rb_tree_iterator<std::pair<const_unsigned_long,_despot::VNode_*>_>::operator++
                (&local_38,0);
    }
    qnode._0_4_ = (int)qnode + 1;
  }
  return;
}

Assistant:

void VNode::Free(const DSPOMDP& model) {
	for (int i = 0; i < particles_.size(); i++) {
		model.Free(particles_[i]);
	}

	for (int a = 0; a < children().size(); a++) {
		QNode* qnode = Child(a);
		map<OBS_TYPE, VNode*>& children = qnode->children();
		for (map<OBS_TYPE, VNode*>::iterator it = children.begin();
			it != children.end(); it++) {
			it->second->Free(model);
		}
	}
}